

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_disarm_aux(loc_conflict grid)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  square_conflict *psVar4;
  trap *ptStack_28;
  _Bool more;
  trap *trap;
  wchar_t chance;
  wchar_t power;
  wchar_t skill;
  loc_conflict grid_local;
  
  psVar4 = square((chunk *)cave,grid);
  ptStack_28 = psVar4->trap;
  grid_local.x._3_1_ = false;
  _Var1 = do_cmd_disarm_test(player,grid);
  if (_Var1) {
    while ((ptStack_28 != (trap *)0x0 &&
           (_Var1 = flag_has_dbg(ptStack_28->flags,2,2,"trap->flags","TRF_TRAP"), !_Var1))) {
      ptStack_28 = ptStack_28->next;
    }
    if (ptStack_28 == (trap *)0x0) {
      grid_local.x._3_1_ = false;
    }
    else {
      _Var1 = flag_has_dbg(ptStack_28->flags,2,9,"trap->flags","TRF_MAGICAL");
      if (_Var1) {
        chance = (player->state).skills[1];
      }
      else {
        chance = (player->state).skills[0];
      }
      if ((((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) || (player->timed[4] != 0)
          ) || (player->timed[6] != 0)) {
        chance = chance / 10;
      }
      iVar2 = cave->depth / 5;
      trap._0_4_ = chance - iVar2;
      if ((int)trap < 2) {
        trap._0_4_ = 2;
      }
      uVar3 = Rand_div(100);
      if ((int)uVar3 < (int)trap) {
        msgt(0x58,"You have disarmed the %s.",ptStack_28->kind->name);
        player_exp_gain(player,iVar2 + 1);
        _Var1 = square_remove_trap((chunk_conflict2 *)cave,grid,ptStack_28,true);
        if (!_Var1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                        ,0x336,"_Bool do_cmd_disarm_aux(struct loc)");
        }
      }
      else {
        uVar3 = Rand_div(100);
        if ((int)trap <= (int)uVar3) {
          msg("You set off the %s!",ptStack_28->kind->name);
          hit_trap(grid,L'\xffffffff');
        }
        else {
          event_signal(EVENT_INPUT_FLUSH);
          msg("You failed to disarm the %s.",ptStack_28->kind->name);
        }
        grid_local.x._3_1_ = (int)trap > (int)uVar3;
      }
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_disarm_aux(struct loc grid)
{
	int skill, power, chance;
    struct trap *trap = square(cave, grid)->trap;
	bool more = false;

	/* Verify legality */
	if (!do_cmd_disarm_test(player, grid)) return (false);

    /* Choose first player trap */
	while (trap) {
		if (trf_has(trap->flags, TRF_TRAP))
			break;
		trap = trap->next;
	}
	if (!trap)
		return false;

	/* Get the base disarming skill */
	if (trf_has(trap->flags, TRF_MAGICAL))
		skill = player->state.skills[SKILL_DISARM_MAGIC];
	else
		skill = player->state.skills[SKILL_DISARM_PHYS];

	/* Penalize some conditions */
	if (player->timed[TMD_BLIND] ||
			no_light(player) ||
			player->timed[TMD_CONFUSED] ||
			player->timed[TMD_IMAGE])
		skill = skill / 10;

	/* Extract trap power */
	power = cave->depth / 5;

	/* Extract the percentage success */
	chance = skill - power;

	/* Always have a small chance of success */
	if (chance < 2) chance = 2;

	/* Two chances - one to disarm, one not to set the trap off */
	if (randint0(100) < chance) {
		msgt(MSG_DISARM, "You have disarmed the %s.", trap->kind->name);
		player_exp_gain(player, 1 + power);

		/* Trap is gone */
		if (!square_remove_trap(cave, grid, trap, true)) {
			assert(0);
		}
	} else if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to disarm the %s.", trap->kind->name);

		/* Player can try again */
		more = true;
	} else {
		msg("You set off the %s!", trap->kind->name);
		hit_trap(grid, -1);
	}

	/* Result */
	return (more);
}